

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::loadSkeleton(Application *this,char *filename,Scene *scene)

{
  Skeleton *this_00;
  bool bVar1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *this_01;
  reference ppSVar2;
  ostream *poVar3;
  char *filename_00;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *this_02;
  reference ppJVar4;
  reference pdVar5;
  long local_2f8;
  double knotTime;
  iterator __end3_1;
  iterator __begin3_1;
  set<double,_std::less<double>,_std::allocator<double>_> *__range3_1;
  Joint *joint;
  iterator __end3;
  iterator __begin3;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range3;
  undefined1 local_260 [8];
  set<double,_std::less<double>,_std::allocator<double>_> knotTimes;
  stringstream loadfilename;
  ostream local_220 [376];
  long local_a8;
  Mesh *mesh;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  string local_78 [4];
  int meshID;
  allocator<char> local_41;
  string local_40 [8];
  string filenameNoExt;
  Scene *scene_local;
  char *filename_local;
  Application *this_local;
  
  filenameNoExt.field_2._8_8_ = scene;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,filename,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::find((char *)local_40,0x2df329);
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_40);
  std::__cxx11::string::operator=(local_40,local_78);
  std::__cxx11::string::~string(local_78);
  __range1._4_4_ = 0;
  this_01 = (set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             *)(filenameNoExt.field_2._8_8_ + 0x98);
  __end1 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(this_01);
  object = (SceneObject *)
           std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::end(this_01);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&object);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end1);
    mesh = (Mesh *)*ppSVar2;
    if (mesh == (Mesh *)0x0) {
      local_2f8 = 0;
    }
    else {
      local_2f8 = __dynamic_cast(mesh,&DynamicScene::SceneObject::typeinfo,
                                 &DynamicScene::Mesh::typeinfo,0);
    }
    local_a8 = local_2f8;
    if (local_2f8 != 0) {
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&knotTimes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      poVar3 = std::operator<<(local_220,local_40);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,__range1._4_4_);
      std::operator<<(poVar3,"_skel.xml");
      this_00 = *(Skeleton **)(local_a8 + 0x168);
      std::__cxx11::stringstream::str();
      filename_00 = (char *)std::__cxx11::string::c_str();
      DynamicScene::Skeleton::load
                ((set<double,_std::less<double>,_std::allocator<double>_> *)local_260,this_00,
                 filename_00);
      std::__cxx11::string::~string((string *)&__range3);
      this_02 = (vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 *)(*(long *)(local_a8 + 0x168) + 0x100);
      __end3 = std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::begin(this_02);
      joint = (Joint *)std::
                       vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                       ::end(this_02);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                    *)&joint);
        if (!bVar1) break;
        ppJVar4 = __gnu_cxx::
                  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                  ::operator*(&__end3);
        DynamicScene::Scene::addObject
                  ((Scene *)filenameNoExt.field_2._8_8_,&(*ppJVar4)->super_SceneObject);
        __gnu_cxx::
        __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                           ((set<double,_std::less<double>,_std::allocator<double>_> *)local_260);
      knotTime = (double)std::set<double,_std::less<double>,_std::allocator<double>_>::end
                                   ((set<double,_std::less<double>,_std::allocator<double>_> *)
                                    local_260);
      while( true ) {
        bVar1 = std::operator!=(&__end3_1,(_Self *)&knotTime);
        if (!bVar1) break;
        pdVar5 = std::_Rb_tree_const_iterator<double>::operator*(&__end3_1);
        Timeline::markTime(&this->timeline,(int)*pdVar5);
        std::_Rb_tree_const_iterator<double>::operator++(&__end3_1);
      }
      __range1._4_4_ = __range1._4_4_ + 1;
      std::set<double,_std::less<double>,_std::allocator<double>_>::~set
                ((set<double,_std::less<double>,_std::allocator<double>_> *)local_260);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)&knotTimes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CMU462::Application::loadSkeleton(const char * filename, DynamicScene::Scene * scene)
{
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects)
  {
    DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>(object);
    if (mesh)
    {
      stringstream loadfilename;
      loadfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      set<double> knotTimes = mesh->skeleton->load(loadfilename.str().c_str());
      // Add all joints to the scene
      for (auto joint : mesh->skeleton->joints)
      {
        scene->addObject(joint);
      }
      // Mark all knots on the timeline
      for (auto knotTime : knotTimes)
      {
        timeline.markTime(knotTime);
      }
      meshID++;
    }
  }
}